

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblySource.cpp
# Opt level: O2

void __thiscall
Js::WebAssemblySource::ReadBufferSource
          (WebAssemblySource *this,Var val,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  TypedArrayBase *pTVar5;
  ArrayBuffer *pAVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  Recycler *this_00;
  uchar *dst;
  undefined1 local_50 [8];
  TrackAllocData data;
  Type src;
  
  bVar2 = VarIs<Js::TypedArrayBase>(val);
  if (bVar2) {
    pTVar5 = VarTo<Js::TypedArrayBase>(val);
    src = pTVar5->buffer;
    uVar3 = pTVar5->BYTES_PER_ELEMENT * (pTVar5->super_ArrayBufferParent).super_ArrayObject.length;
  }
  else {
    bVar2 = VarIs<Js::ArrayBuffer>(val);
    if (!bVar2) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e4a6,(PCWSTR)0x0);
    }
    pAVar6 = VarTo<Js::ArrayBuffer>(val);
    iVar4 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pAVar6);
    src = (Type)CONCAT44(extraout_var,iVar4);
    uVar3 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x71])(pAVar6);
  }
  this->bufferLength = uVar3;
  if ((src == (Type)0x0) && (uVar3 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/WebAssemblySource.cpp"
                                ,0x2f,"(srcBuffer || bufferLength == 0)",
                                "srcBuffer || bufferLength == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
    uVar3 = this->bufferLength;
  }
  if (uVar3 != 0) {
    data.plusSize = (size_t)uVar3;
    local_50 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_471699a;
    data.filename._0_4_ = 0x33;
    this_00 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
    dst = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                    ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,
                     (ulong)this->bufferLength);
    this->buffer = dst;
    js_memcpy_s(dst,(ulong)this->bufferLength,src,(ulong)this->bufferLength);
  }
  return;
}

Assistant:

void WebAssemblySource::ReadBufferSource(Var val, ScriptContext * scriptContext)
{
    BYTE* srcBuffer;
    if (Js::VarIs<Js::TypedArrayBase>(val))
    {
        Js::TypedArrayBase* array = Js::VarTo<Js::TypedArrayBase>(val);
        srcBuffer = array->GetByteBuffer();
        bufferLength = array->GetByteLength();
    }
    else if (Js::VarIs<Js::ArrayBuffer>(val))
    {
        Js::ArrayBuffer* arrayBuffer = Js::VarTo<Js::ArrayBuffer>(val);
        srcBuffer = arrayBuffer->GetBuffer();
        bufferLength = arrayBuffer->GetByteLength();
    }
    else
    {
        // The buffer was not a TypedArray nor an ArrayBuffer
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }
    Assert(srcBuffer || bufferLength == 0);
    if (bufferLength > 0)
    {
        // copy buffer so external changes to it don't cause issues when defer parsing
        buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), byte, bufferLength);
        js_memcpy_s(buffer, bufferLength, srcBuffer, bufferLength);
    }
}